

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::PushNodeVersion
          (PeerManagerImpl *this,CNode *pnode,Peer *peer)

{
  CConnman *this_00;
  string msg_type;
  string_view source_file;
  string_view source_file_00;
  bool bVar1;
  time_point tVar2;
  Logger *pLVar3;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  unsigned_long *args_7;
  long *args_4;
  undefined7 uStack_1d8;
  bool tx_relay;
  uint64_t your_services;
  NodeId nodeid;
  int nNodeStartingHeight;
  uint64_t nonce;
  int64_t nTime;
  uint64_t my_services;
  string local_198;
  direct_or_indirect local_178;
  uint local_168;
  long *local_150;
  char *local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  undefined8 uStack_138;
  CService addr_you;
  CAddress addr;
  string log_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  SerParams *local_98;
  direct_or_indirect *local_90;
  SerParams *local_78;
  CService *local_70;
  long *local_58;
  char *pcStack_50;
  long local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  my_services = peer->m_our_services;
  tVar2 = NodeClock::now();
  nTime = (long)tVar2.__d.__r / 1000000000;
  nonce = pnode->nLocalHostNonce;
  nNodeStartingHeight = (this->m_best_height).super___atomic_base<int>._M_i;
  nodeid = pnode->id;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&pnode->addr);
  addr.super_CService.super_CNetAddr.m_net = (pnode->addr).super_CService.super_CNetAddr.m_net;
  addr.super_CService.super_CNetAddr.m_scope_id =
       (pnode->addr).super_CService.super_CNetAddr.m_scope_id;
  addr.super_CService.port = (pnode->addr).super_CService.port;
  addr.nTime.__d.__r = (duration)(pnode->addr).nTime.__d.__r;
  addr.nServices = (pnode->addr).nServices;
  bVar1 = CNetAddr::IsRoutable((CNetAddr *)&addr);
  if (((!bVar1) || (bVar1 = IsProxy((CNetAddr *)&addr), bVar1)) ||
     (bVar1 = CNetAddr::IsAddrV1Compatible((CNetAddr *)&addr), !bVar1)) {
    CService::CService(&addr_you);
  }
  else {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_you,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
    addr_you.super_CNetAddr.m_net = addr.super_CService.super_CNetAddr.m_net;
    addr_you.super_CNetAddr.m_scope_id = addr.super_CService.super_CNetAddr.m_scope_id;
    addr_you.port = addr.super_CService.port;
  }
  your_services = addr.nServices;
  if ((pnode->m_conn_type - FEELER < 2) ||
     (((this->m_opts).ignore_incoming_txs == true && ((pnode->m_permission_flags & Relay) == None)))
     ) {
    tx_relay = false;
  }
  else {
    tx_relay = true;
  }
  local_150 = (long *)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"version","");
  local_78 = &CNetAddr::V1;
  local_70 = &addr_you;
  args_7 = (unsigned_long *)0x1dd4ed;
  CService::CService((CService *)&local_178.indirect_contents);
  local_98 = &CNetAddr::V1;
  this_00 = this->m_connman;
  if (local_150 == (long *)&local_140) {
    uStack_40 = uStack_138;
    local_58 = &local_48;
  }
  else {
    local_58 = local_150;
  }
  local_48 = CONCAT71(uStack_13f,local_140);
  pcStack_50 = local_148;
  local_148 = (char *)0x0;
  local_140 = 0;
  msg_type._M_string_length = (size_type)&my_services;
  msg_type._M_dataplus._M_p = (pointer)&local_78;
  msg_type.field_2._M_allocated_capacity = (size_type)&local_98;
  msg_type.field_2._8_8_ = &nonce;
  local_150 = (long *)&local_140;
  local_90 = &local_178;
  NetMsg::
  Make<int_const&,unsigned_long&,long_const&,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,std::__cxx11::string&,int_const&,bool_const&>
            ((CSerializedNetMsg *)&log_msg,(NetMsg *)&local_58,msg_type,&PROTOCOL_VERSION,
             &my_services,&nTime,&your_services,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&strSubVersion_abi_cxx11_,
             (unsigned_long *)&nNodeStartingHeight,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&tx_relay,args_7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(tx_relay,uStack_1d8),(int *)your_services,(bool *)nodeid);
  CConnman::PushMessage(this_00,pnode,(CSerializedNetMsg *)&log_msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)log_msg.field_2._8_8_ != &local_a8) {
    operator_delete((void *)log_msg.field_2._8_8_,local_a8._M_allocated_capacity + 1);
  }
  if (log_msg._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(log_msg._M_dataplus._M_p,
                    CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                             log_msg.field_2._M_local_buf[0]) - (long)log_msg._M_dataplus._M_p);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (0x10 < local_168) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  if (local_150 != (long *)&local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  if (fLogIPs == true) {
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
    if (!bVar1) goto LAB_001dd714;
    CService::ToStringAddrPort_abi_cxx11_(&local_198,&addr_you);
    pLVar3 = LogInstance();
    args_4 = (long *)0x1dd6c3;
    bVar1 = BCLog::Logger::Enabled(pLVar3);
    if (bVar1) {
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      tinyformat::format<int,int,std::__cxx11::string,bool,long>
                ((string *)&local_178.indirect_contents,
                 (tinyformat *)
                 "send version message: version %d, blocks=%d, them=%s, txrelay=%d, peer=%d\n",
                 (char *)&PROTOCOL_VERSION,&nNodeStartingHeight,(int *)&local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx_relay,
                 (bool *)&nodeid,args_4);
      _GLOBAL__N_1::PeerManagerImpl::PushNodeVersion();
      pLVar3 = LogInstance();
      local_58 = (long *)0x5b;
      pcStack_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp";
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
      ;
      source_file_00._M_len = 0x5b;
      str_00._M_str = log_msg._M_dataplus._M_p;
      str_00._M_len = log_msg._M_string_length;
      logging_function_00._M_str = "PushNodeVersion";
      logging_function_00._M_len = 0xf;
      BCLog::Logger::LogPrintStr(pLVar3,str_00,logging_function_00,source_file_00,0x68d,NET,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
        operator_delete(log_msg._M_dataplus._M_p,
                        CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                                 log_msg.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_001dd714;
  }
  else {
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
    if (!bVar1) goto LAB_001dd714;
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar3);
    if (!bVar1) goto LAB_001dd714;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    tinyformat::format<int,int,bool,long>
              ((string *)&local_178.indirect_contents,
               (tinyformat *)"send version message: version %d, blocks=%d, txrelay=%d, peer=%d\n",
               (char *)&PROTOCOL_VERSION,&nNodeStartingHeight,(int *)&tx_relay,(bool *)&nodeid,
               (long *)CONCAT17(tx_relay,uStack_1d8));
    _GLOBAL__N_1::PeerManagerImpl::PushNodeVersion();
    pLVar3 = LogInstance();
    local_58 = (long *)0x5b;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp";
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x5b;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    logging_function._M_str = "PushNodeVersion";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x68f,NET,Debug);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)log_msg._M_dataplus._M_p == &log_msg.field_2) goto LAB_001dd714;
    local_198.field_2._M_allocated_capacity =
         CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,log_msg.field_2._M_local_buf[0]);
    local_198._M_dataplus = log_msg._M_dataplus;
  }
  operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
LAB_001dd714:
  if (0x10 < addr_you.super_CNetAddr.m_addr._size) {
    free(addr_you.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr_you.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
    free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::PushNodeVersion(CNode& pnode, const Peer& peer)
{
    uint64_t my_services{peer.m_our_services};
    const int64_t nTime{count_seconds(GetTime<std::chrono::seconds>())};
    uint64_t nonce = pnode.GetLocalNonce();
    const int nNodeStartingHeight{m_best_height};
    NodeId nodeid = pnode.GetId();
    CAddress addr = pnode.addr;

    CService addr_you = addr.IsRoutable() && !IsProxy(addr) && addr.IsAddrV1Compatible() ? addr : CService();
    uint64_t your_services{addr.nServices};

    const bool tx_relay{!RejectIncomingTxs(pnode)};
    MakeAndPushMessage(pnode, NetMsgType::VERSION, PROTOCOL_VERSION, my_services, nTime,
            your_services, CNetAddr::V1(addr_you), // Together the pre-version-31402 serialization of CAddress "addrYou" (without nTime)
            my_services, CNetAddr::V1(CService{}), // Together the pre-version-31402 serialization of CAddress "addrMe" (without nTime)
            nonce, strSubVersion, nNodeStartingHeight, tx_relay);

    if (fLogIPs) {
        LogDebug(BCLog::NET, "send version message: version %d, blocks=%d, them=%s, txrelay=%d, peer=%d\n", PROTOCOL_VERSION, nNodeStartingHeight, addr_you.ToStringAddrPort(), tx_relay, nodeid);
    } else {
        LogDebug(BCLog::NET, "send version message: version %d, blocks=%d, txrelay=%d, peer=%d\n", PROTOCOL_VERSION, nNodeStartingHeight, tx_relay, nodeid);
    }
}